

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

int htmlAutoCloseTag(htmlDocPtr doc,xmlChar *name,htmlNodePtr elem)

{
  htmlNodePtr elem_00;
  int iVar1;
  int iVar2;
  _xmlNode **pp_Var3;
  
  iVar2 = 1;
  if (elem != (htmlNodePtr)0x0) {
    iVar1 = xmlStrEqual(name,elem->name);
    if (iVar1 == 0) {
      iVar1 = htmlCheckAutoClose(elem->name,name);
      if (iVar1 == 0) {
        pp_Var3 = &elem->children;
        do {
          elem_00 = *pp_Var3;
          if (elem_00 == (htmlNodePtr)0x0) goto LAB_0016368f;
          iVar1 = htmlAutoCloseTag(doc,name,elem_00);
          pp_Var3 = &elem_00->next;
        } while (iVar1 == 0);
      }
    }
    else {
LAB_0016368f:
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
htmlAutoCloseTag(htmlDocPtr doc, const xmlChar *name, htmlNodePtr elem) {
    htmlNodePtr child;

    if (elem == NULL) return(1);
    if (xmlStrEqual(name, elem->name)) return(0);
    if (htmlCheckAutoClose(elem->name, name)) return(1);
    child = elem->children;
    while (child != NULL) {
        if (htmlAutoCloseTag(doc, name, child)) return(1);
	child = child->next;
    }
    return(0);
}